

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

__sighandler_t signal(int __sig,__sighandler_t __handler)

{
  int *piVar1;
  _func_void_int *local_28;
  _func_void_int *oldhandler;
  _func_void_int *func_local;
  _func_void_int *p_Stack_10;
  int sig_local;
  
  if ((__sig < 1) || (__handler == (__sighandler_t)0xffffffffffffffff)) {
    p_Stack_10 = (_func_void_int *)0xffffffffffffffff;
  }
  else {
    switch(__sig) {
    case 2:
      local_28 = _PDCLIB_sigint;
      _PDCLIB_sigint = (_func_void_int *)__handler;
      break;
    default:
      piVar1 = _PDCLIB_errno_func();
      *piVar1 = 0x16;
      return (__sighandler_t)0xffffffffffffffff;
    case 4:
      local_28 = _PDCLIB_sigill;
      _PDCLIB_sigill = (_func_void_int *)__handler;
      break;
    case 6:
      local_28 = _PDCLIB_sigabrt;
      _PDCLIB_sigabrt = (_func_void_int *)__handler;
      break;
    case 8:
      local_28 = _PDCLIB_sigfpe;
      _PDCLIB_sigfpe = (_func_void_int *)__handler;
      break;
    case 0xb:
      local_28 = _PDCLIB_sigsegv;
      _PDCLIB_sigsegv = (_func_void_int *)__handler;
      break;
    case 0xf:
      local_28 = _PDCLIB_sigterm;
      _PDCLIB_sigterm = (_func_void_int *)__handler;
    }
    p_Stack_10 = local_28;
  }
  return (__sighandler_t)p_Stack_10;
}

Assistant:

void ( *signal( int sig, void ( *func )( int ) ) )( int )
{
    void ( *oldhandler )( int );

    if ( sig <= 0 || func == SIG_ERR )
    {
        return SIG_ERR;
    }

    switch ( sig )
    {
        case SIGABRT:
            oldhandler = _PDCLIB_sigabrt;
            _PDCLIB_sigabrt = func;
            break;

        case SIGFPE:
            oldhandler = _PDCLIB_sigfpe;
            _PDCLIB_sigfpe = func;
            break;

        case SIGILL:
            oldhandler = _PDCLIB_sigill;
            _PDCLIB_sigill = func;
            break;

        case SIGINT:
            oldhandler = _PDCLIB_sigint;
            _PDCLIB_sigint = func;
            break;

        case SIGSEGV:
            oldhandler = _PDCLIB_sigsegv;
            _PDCLIB_sigsegv = func;
            break;

        case SIGTERM:
            oldhandler = _PDCLIB_sigterm;
            _PDCLIB_sigterm = func;
            break;

        default:
            /* The standard calls for an unspecified "positive value".
               Copying Linux' behaviour of setting EINVAL.
            */
            *_PDCLIB_errno_func() = _PDCLIB_EINVAL;
            return SIG_ERR;
    }

    return oldhandler;
}